

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgt.cpp
# Opt level: O3

bool ReadMGT(MemFile *file,shared_ptr<Disk> *disk)

{
  ushort uVar1;
  uchar *__src;
  ushort *puVar2;
  Disk *this;
  element_type *peVar3;
  char extraout_AL;
  bool bVar4;
  bool bVar5;
  int iVar6;
  string *path;
  Data *data;
  char *pcVar7;
  uint uVar8;
  FILE *pFVar9;
  MGT_DISK_INFO di;
  array<unsigned_char,_512UL> sector0;
  MGT_DISK_INFO local_2a0;
  FILE local_270 [2];
  
  pFVar9 = (FILE *)disk;
  iVar6 = MemFile::size(file);
  if (((iVar6 != 0xc8000) || (MemFile::rewind(file,pFVar9), extraout_AL == '\0')) ||
     (iVar6 = MemFile::remaining(file), iVar6 < 0x200)) {
    return false;
  }
  __src = (file->m_it)._M_current;
  memcpy((void *)((long)local_270 + 0x40U),__src,0x200);
  (file->m_it)._M_current = __src + 0x200;
  local_2a0.disk_label._M_dataplus._M_p = (pointer)&local_2a0.disk_label.field_2;
  local_2a0.dos_type = SAMDOS;
  local_2a0.dir_tracks = 4;
  local_2a0.disk_label._M_string_length = 0;
  local_2a0.disk_label.field_2._M_local_buf[0] = '\0';
  local_2a0.serial_number = 0;
  GetDiskInfo((uint8_t *)((long)local_270 + 0x40U),&local_2a0);
  bVar4 = MemFile::seek(file,local_2a0.dir_tracks * 0x2800 + 0x1fe);
  if (bVar4) {
    iVar6 = MemFile::remaining(file);
    if (iVar6 < 2) goto LAB_001983f2;
    puVar2 = (ushort *)(file->m_it)._M_current;
    uVar8 = (uint)*puVar2;
    (file->m_it)._M_current = (uchar *)(puVar2 + 1);
    bVar4 = (uVar8 & 0xff00) == 0x200 && local_2a0.dir_tracks == (uVar8 & 0xff);
    uVar8 = local_2a0.dir_tracks;
  }
  else {
LAB_001983f2:
    bVar4 = false;
    uVar8 = local_2a0.dir_tracks;
  }
  uVar8 = uVar8 * 0x1400 + 0x1fe;
  pFVar9 = (FILE *)(ulong)uVar8;
  bVar5 = MemFile::seek(file,uVar8);
  if ((bVar5) && (iVar6 = MemFile::remaining(file), 1 < iVar6)) {
    puVar2 = (ushort *)(file->m_it)._M_current;
    uVar1 = *puVar2;
    (file->m_it)._M_current = (uchar *)(puVar2 + 1);
    if (local_2a0.dir_tracks != (uint)(byte)uVar1) goto LAB_00198441;
    bVar5 = (uVar1 & 0xff00) == 0x200;
  }
  else {
LAB_00198441:
    bVar5 = false;
  }
  if (!bVar4 && bVar5 == false) {
    path = MemFile::name_abi_cxx11_(file);
    local_270[0]._0_8_ = (long)local_270 + 0x10U;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"mgt","");
    pFVar9 = local_270;
    bVar4 = IsFileExt(path,(string *)pFVar9);
    if (local_270[0]._0_8_ != (long)local_270 + 0x10U) {
      pFVar9 = (FILE *)(local_270[0]._IO_read_end + 1);
      operator_delete((void *)local_270[0]._0_8_,(ulong)pFVar9);
    }
    if (!bVar4) {
      bVar4 = false;
      goto LAB_0019850e;
    }
  }
  MemFile::rewind(file,pFVar9);
  this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  Format::Format((Format *)local_270,MGT);
  data = MemFile::data(file);
  Disk::format(this,(Format *)local_270,data,bVar5);
  pcVar7 = "MGT";
  if (bVar5 != false) {
    pcVar7 = "IMG";
  }
  peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  bVar4 = true;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar3->strType,0,(char *)(peVar3->strType)._M_string_length,(ulong)pcVar7);
LAB_0019850e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.disk_label._M_dataplus._M_p == &local_2a0.disk_label.field_2) {
    return bVar4;
  }
  operator_delete(local_2a0.disk_label._M_dataplus._M_p,
                  CONCAT71(local_2a0.disk_label.field_2._M_allocated_capacity._1_7_,
                           local_2a0.disk_label.field_2._M_local_buf[0]) + 1);
  return bVar4;
}

Assistant:

bool ReadMGT(MemFile& file, std::shared_ptr<Disk>& disk)
{
    if (file.size() != MGT_DISK_SIZE)
        return false;

    // Read the first sector, which contains disk information.
    std::array<uint8_t, SECTOR_SIZE> sector0;
    if (!file.rewind() || !file.read(sector0))
        return false;

    MGT_DISK_INFO di{};
    GetDiskInfo(sector0.data(), di);

    // Check the expected chain offset in MGT images (alternating sides).
    std::array<uint8_t, 2> buf;
    auto offset = (di.dir_tracks * MGT_SIDES * MGT_TRACK_SIZE) + SECTOR_SIZE - 2;
    bool mgt = file.seek(offset) && file.read(buf) && buf[0] == di.dir_tracks && buf[1] == 2;

    // Check the expected chain offset in IMG images (side 0 then side 1).
    offset = (di.dir_tracks * MGT_TRACK_SIZE) + SECTOR_SIZE - 2;
    bool img = file.seek(offset) && file.read(buf) && buf[0] == di.dir_tracks && buf[1] == 2;

    // If neither signature matched this probably isn't an MGT file.
    // However, accept it if it has a .mgt file extension.
    if (!mgt && !img && !IsFileExt(file.name(), "mgt"))
        return false;

    file.rewind();
    disk->format(Format(RegularFormat::MGT), file.data(), img);
    disk->strType = img ? "IMG" : "MGT";

    return true;
}